

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O2

bool __thiscall
RealtimeHelper::playMIDIShortMessageRealtime(RealtimeHelper *this,Bit32u msg,quint64 timestamp)

{
  QSynth *this_00;
  Synth *this_01;
  bool bVar1;
  Bit32u timestamp_00;
  RealtimeLocker midiLocker;
  
  midiLocker.mutex = this->qsynth->midiMutex;
  bVar1 = false;
  LOCK();
  midiLocker.locked =
       ((midiLocker.mutex)->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
  if (midiLocker.locked) {
    ((midiLocker.mutex)->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
  }
  UNLOCK();
  if (midiLocker.locked) {
    this_00 = this->qsynth;
    if (this_00->state == SynthState_OPEN) {
      this_01 = this_00->synth;
      timestamp_00 = QSynth::convertOutputToSynthTimestamp(this_00,timestamp);
      bVar1 = MT32Emu::Synth::playMsg(this_01,msg,timestamp_00);
    }
    else {
      bVar1 = false;
    }
  }
  RealtimeLocker::~RealtimeLocker(&midiLocker);
  return bVar1;
}

Assistant:

bool playMIDIShortMessageRealtime(Bit32u msg, quint64 timestamp) const {
		RealtimeLocker midiLocker(*qsynth.midiMutex);
		return midiLocker.isLocked() && qsynth.isOpen() && qsynth.synth->playMsg(msg, qsynth.convertOutputToSynthTimestamp(timestamp));
	}